

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_cyclicrefresh.c
# Opt level: O0

void av1_cyclic_refresh_set_golden_update(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  CYCLIC_REFRESH *pCVar2;
  int local_30;
  int gf_length_mult [2];
  CYCLIC_REFRESH *cr;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMP *cpi_local;
  
  pAVar1 = cpi->ppi;
  pCVar2 = cpi->cyclic_refresh;
  gf_length_mult[0] = 8;
  gf_length_mult[1] = 4;
  if (pCVar2->percent_refresh < 1) {
    (pAVar1->p_rc).baseline_gf_interval = 0x50;
  }
  else {
    if (gf_length_mult[(cpi->sf).rt_sf.gf_length_lvl] * (int)(100 / (long)pCVar2->percent_refresh) <
        0xa0) {
      local_30 = gf_length_mult[(cpi->sf).rt_sf.gf_length_lvl] *
                 (int)(100 / (long)pCVar2->percent_refresh);
    }
    else {
      local_30 = 0xa0;
    }
    (pAVar1->p_rc).baseline_gf_interval = local_30;
  }
  if (((cpi->rc).avg_frame_low_motion != 0) && ((cpi->rc).avg_frame_low_motion < 0x28)) {
    (pAVar1->p_rc).baseline_gf_interval = 0x10;
  }
  return;
}

Assistant:

void av1_cyclic_refresh_set_golden_update(AV1_COMP *const cpi) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
  // Set minimum gf_interval for GF update to a multiple of the refresh period,
  // with some max limit. Depending on past encoding stats, GF flag may be
  // reset and update may not occur until next baseline_gf_interval.
  const int gf_length_mult[2] = { 8, 4 };
  if (cr->percent_refresh > 0)
    p_rc->baseline_gf_interval =
        AOMMIN(gf_length_mult[cpi->sf.rt_sf.gf_length_lvl] *
                   (100 / cr->percent_refresh),
               MAX_GF_INTERVAL_RT);
  else
    p_rc->baseline_gf_interval = FIXED_GF_INTERVAL_RT;
  if (rc->avg_frame_low_motion && rc->avg_frame_low_motion < 40)
    p_rc->baseline_gf_interval = 16;
}